

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool __thiscall
ctemplate::Template::BuildTree(Template *this,char *input_buffer,char *input_buffer_end)

{
  TemplateState TVar1;
  bool bVar2;
  SectionTemplateNode *this_00;
  TemplateToken local_58;
  
  this->state_ = TS_EMPTY;
  (this->parse_state_).bufstart = input_buffer;
  (this->parse_state_).bufend = input_buffer_end;
  (this->parse_state_).phase = GETTING_TEXT;
  (this->parse_state_).current_delimiters.start_marker = "{{";
  (this->parse_state_).current_delimiters.start_marker_len = 2;
  (this->parse_state_).current_delimiters.end_marker = "}}";
  (this->parse_state_).current_delimiters.end_marker_len = 2;
  this_00 = (SectionTemplateNode *)operator_new(0xa0);
  local_58.type = TOKENTYPE_SECTION_START;
  local_58.text = "__{{MAIN}}__";
  local_58.textlen = 0xc;
  local_58.modvals.
  super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.modvals.
  super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.modvals.
  super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SectionTemplateNode::SectionTemplateNode(this_00,&local_58,false);
  if (local_58.modvals.
      super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.modvals.
                    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  do {
    bVar2 = SectionTemplateNode::AddSubnode(this_00,this);
  } while (bVar2);
  if (this->tree_ != (SectionTemplateNode *)0x0) {
    (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
  }
  if (this->template_text_ != (char *)0x0) {
    operator_delete__(this->template_text_);
  }
  this->tree_ = this_00;
  this->template_text_ = input_buffer;
  this->template_text_len_ = (int)input_buffer_end - (int)input_buffer;
  TVar1 = this->state_;
  if (TVar1 == TS_ERROR) {
    (*(this_00->super_TemplateNode)._vptr_TemplateNode[1])(this_00);
    this->tree_ = (SectionTemplateNode *)0x0;
    if (this->template_text_ != (char *)0x0) {
      operator_delete__(this->template_text_);
    }
    this->template_text_ = (char *)0x0;
    this->template_text_len_ = 0;
  }
  else {
    this->state_ = TS_READY;
  }
  return TVar1 != TS_ERROR;
}

Assistant:

bool Template::BuildTree(const char* input_buffer,
                         const char* input_buffer_end) {
  set_state(TS_EMPTY);
  parse_state_.bufstart = input_buffer;
  parse_state_.bufend = input_buffer_end;
  parse_state_.phase = ParseState::GETTING_TEXT;
  parse_state_.current_delimiters = Template::MarkerDelimiters();
  // Assign an arbitrary name to the top-level node
  SectionTemplateNode *top_node = new SectionTemplateNode(
      TemplateToken(TOKENTYPE_SECTION_START,
                    kMainSectionName, strlen(kMainSectionName), NULL),
      false);
  while (top_node->AddSubnode(this)) {
    // Add the rest of the template in.
  }

  // get rid of the old tree, whenever we try to build a new one.
  delete tree_;
  delete[] template_text_;
  tree_ = top_node;
  template_text_ = input_buffer;
  template_text_len_ = input_buffer_end - input_buffer;

  // TS_ERROR can also be set by the auto-escape mode, at the point
  // where the parser failed to parse.
  if (state() != TS_ERROR) {
    set_state(TS_READY);
    return true;
  } else {
    delete tree_;
    tree_ = NULL;
    delete[] template_text_;
    template_text_ = NULL;
    template_text_len_ = 0;
    return false;
  }
}